

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Regexp * re2::Regexp::LiteralString(Rune *runes,int nrunes,ParseFlags flags)

{
  Regexp *pRVar1;
  ulong uVar2;
  
  if (nrunes < 1) {
    pRVar1 = (Regexp *)operator_new(0x28);
    pRVar1->op_ = '\x02';
    pRVar1->simple_ = '\0';
    pRVar1->parse_flags_ = (uint16)flags;
    pRVar1->ref_ = 1;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
  }
  else {
    if (nrunes == 1) {
      pRVar1 = NewLiteral(*runes,flags);
      return pRVar1;
    }
    pRVar1 = (Regexp *)operator_new(0x28);
    pRVar1->op_ = '\x04';
    pRVar1->simple_ = '\0';
    pRVar1->parse_flags_ = (uint16)flags;
    pRVar1->ref_ = 1;
    *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
    *(undefined8 *)&pRVar1->nsub_ = 0;
    *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
    for (uVar2 = 0; (uint)nrunes != uVar2; uVar2 = uVar2 + 1) {
      AddRuneToString(pRVar1,runes[uVar2]);
    }
  }
  return pRVar1;
}

Assistant:

Regexp* Regexp::LiteralString(Rune* runes, int nrunes, ParseFlags flags) {
  if (nrunes <= 0)
    return new Regexp(kRegexpEmptyMatch, flags);
  if (nrunes == 1)
    return NewLiteral(runes[0], flags);
  Regexp* re = new Regexp(kRegexpLiteralString, flags);
  for (int i = 0; i < nrunes; i++)
    re->AddRuneToString(runes[i]);
  return re;
}